

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  long lVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int *piVar6;
  undefined8 in_RCX;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  sexp_conflict sexp_passwd_type_obj;
  sexp_conflict sexp_group_type_obj;
  int **local_98;
  undefined8 local_90;
  int *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  long local_48;
  char *local_40;
  char *local_38;
  undefined8 local_30;
  long local_18;
  
  local_58 = 0x43e;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_18 = in_RDI;
  memset(&local_68,0,0x10);
  local_70 = 0x43e;
  memset(&local_80,0,0x10);
  local_88 = (int *)0x43e;
  memset(&local_98,0,0x10);
  iVar2 = strcmp(local_38,"0.11.0");
  if ((iVar2 == 0) && (iVar2 = strncmp(local_40,"cv-gm*uh",8), iVar2 == 0)) {
    local_68 = &local_58;
    local_60 = *(undefined8 *)(local_18 + 0x6080);
    *(undefined8 ***)(local_18 + 0x6080) = &local_68;
    local_80 = &local_70;
    local_78 = *(undefined8 *)(local_18 + 0x6080);
    *(undefined8 ***)(local_18 + 0x6080) = &local_80;
    local_98 = &local_88;
    local_90 = *(undefined8 *)(local_18 + 0x6080);
    *(int ****)(local_18 + 0x6080) = &local_98;
    local_58 = sexp_c_string(local_18,"group",0xffffffffffffffff);
    local_48 = sexp_register_type_op
                         (local_18,0,0x12,local_58,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                          "sexp_finalize_c_type",sexp_finalize_c_type);
    local_70 = sexp_string_to_symbol_op(local_18,0,1,local_58);
    sexp_env_define(local_18,local_30,local_70,local_48);
    lVar1 = local_18;
    *(undefined8 *)(local_48 + 0x18) = 0x23e;
    lVar3 = local_48 + 0x18;
    uVar4 = sexp_intern(local_18,"gr_gid",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar3,uVar4);
    lVar1 = local_18;
    lVar3 = local_48 + 0x18;
    uVar4 = sexp_intern(local_18,"gr_passwd",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar3,uVar4);
    lVar1 = local_18;
    lVar3 = local_48 + 0x18;
    uVar4 = sexp_intern(local_18,"gr_name",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar3,uVar4);
    uVar4 = sexp_make_vector_op(local_18,0,2,7,0x3e);
    *(undefined8 *)(local_48 + 0x20) = uVar4;
    uVar4 = sexp_make_vector_op(local_18,0,2,7,0x3e);
    *(undefined8 *)(local_48 + 0x28) = uVar4;
    local_70 = sexp_make_type_predicate_op(local_18,0,2,local_58,local_48);
    local_58 = sexp_intern(local_18,"group?",6);
    sexp_env_define(local_18,local_30,local_58,local_70);
    local_58 = sexp_c_string(local_18,"passwd",0xffffffffffffffff);
    local_50 = sexp_register_type_op
                         (local_18,0,0x12,local_58,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                          "sexp_finalize_c_type",sexp_finalize_c_type);
    local_70 = sexp_string_to_symbol_op(local_18,0,1,local_58);
    sexp_env_define(local_18,local_30,local_70,local_50);
    lVar1 = local_18;
    *(undefined8 *)(local_50 + 0x18) = 0x23e;
    lVar3 = local_50 + 0x18;
    uVar4 = sexp_intern(local_18,"pw_shell",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar3,uVar4);
    lVar1 = local_18;
    lVar3 = local_50 + 0x18;
    uVar4 = sexp_intern(local_18,"pw_dir",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar3,uVar4);
    lVar1 = local_18;
    lVar3 = local_50 + 0x18;
    uVar4 = sexp_intern(local_18,"pw_gecos",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar3,uVar4);
    lVar1 = local_18;
    lVar3 = local_50 + 0x18;
    uVar4 = sexp_intern(local_18,"pw_gid",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar3,uVar4);
    lVar1 = local_18;
    lVar3 = local_50 + 0x18;
    uVar4 = sexp_intern(local_18,"pw_uid",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar3,uVar4);
    lVar1 = local_18;
    lVar3 = local_50 + 0x18;
    uVar4 = sexp_intern(local_18,"pw_passwd",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar3,uVar4);
    lVar1 = local_18;
    lVar3 = local_50 + 0x18;
    uVar4 = sexp_intern(local_18,"pw_name",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar3,uVar4);
    uVar4 = sexp_make_vector_op(local_18,0,2,0xf,0x3e);
    *(undefined8 *)(local_50 + 0x20) = uVar4;
    uVar4 = sexp_make_vector_op(local_18,0,2,0xf,0x3e);
    *(undefined8 *)(local_50 + 0x28) = uVar4;
    local_70 = sexp_make_type_predicate_op(local_18,0,2,local_58);
    local_58 = sexp_intern(local_18,"user?",5);
    sexp_env_define(local_18,local_30,local_58,local_70);
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"user-shell",1,0,"sexp_passwd_get_pw_shell",
                                 sexp_passwd_get_pw_shell,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x13;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x40) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"user-home",1,0,"sexp_passwd_get_pw_dir",
                                 sexp_passwd_get_pw_dir,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x13;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x38) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"user-gecos",1,0,"sexp_passwd_get_pw_gecos",
                                 sexp_passwd_get_pw_gecos,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x13;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x30) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"user-group-id",1,0,"sexp_passwd_get_pw_gid",
                                 sexp_passwd_get_pw_gid,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x28) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"user-id",1,0,"sexp_passwd_get_pw_uid",
                                 sexp_passwd_get_pw_uid,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x20) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"user-password",1,0,"sexp_passwd_get_pw_passwd",
                                 sexp_passwd_get_pw_passwd,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x13;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x18) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"user-name",1,0,"sexp_passwd_get_pw_name",
                                 sexp_passwd_get_pw_name,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x13;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_50 + 0x20) & 3) == 0) && (**(int **)(local_50 + 0x20) == 10)) {
      *(int **)(*(long *)(local_50 + 0x20) + 0x10) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"group-id",1,0,"sexp_group_get_gr_gid",
                                 sexp_group_get_gr_gid,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x20) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"group-password",1,0,"sexp_group_get_gr_passwd",
                                 sexp_group_get_gr_passwd,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x13;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x18) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"group-name",1,0,"sexp_group_get_gr_name",
                                 sexp_group_get_gr_name,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x13;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x10) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"getgrnam-safe",2,0,"sexp_getgrnam_safe_stub",
                                 sexp_getgrnam_safe_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 0x13;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      local_88[0x10] = 0x13;
      local_88[0x11] = 0;
      uVar4 = sexp_make_vector_op(local_18,0,2,5,1);
      *(undefined8 *)(local_88 + 0x12) = uVar4;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x10) = 5;
      *(ulong *)(*(long *)(local_88 + 0x12) + 0x18) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"getgrgid-safe",2,0,"sexp_getgrgid_safe_stub",
                                 sexp_getgrgid_safe_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      local_88[0x10] = 0x13;
      local_88[0x11] = 0;
      uVar4 = sexp_make_vector_op(local_18,0,2,5,1);
      *(undefined8 *)(local_88 + 0x12) = uVar4;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x10) = 5;
      *(ulong *)(*(long *)(local_88 + 0x12) + 0x18) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"getpwnam_r",2,0,"sexp_getpwnam_r_stub",
                                 sexp_getpwnam_r_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 0x13;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      local_88[0x10] = 0x13;
      local_88[0x11] = 0;
      uVar4 = sexp_make_vector_op(local_18,0,2,5,1);
      *(undefined8 *)(local_88 + 0x12) = uVar4;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x10) = 5;
      *(ulong *)(*(long *)(local_88 + 0x12) + 0x18) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"getpwuid_r",2,0,"sexp_getpwuid_r_stub",
                                 sexp_getpwuid_r_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      local_88[0x10] = 0x13;
      local_88[0x11] = 0;
      uVar4 = sexp_make_vector_op(local_18,0,2,5,1);
      *(undefined8 *)(local_88 + 0x12) = uVar4;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x10) = 5;
      *(ulong *)(*(long *)(local_88 + 0x12) + 0x18) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"set-root-directory!",1,0,
                                 "sexp_set_root_directory_x_stub",sexp_set_root_directory_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 0x13;
      local_88[0xd] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"create-session",0,0,"sexp_create_session_stub",
                                 sexp_create_session_stub,0);
    lVar1 = local_18;
    uVar4 = local_30;
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
    }
    uVar5 = sexp_make_integer(local_18,0,0);
    local_88 = (int *)sexp_define_foreign_aux
                                (lVar1,uVar4,"current-session-id",1,1,"sexp_current_session_id_stub"
                                 ,sexp_current_session_id_stub,uVar5);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"set-current-effective-group-id!",1,0,
                                 "sexp_set_current_effective_group_id_x_stub",
                                 sexp_set_current_effective_group_id_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"set-current-group-id!",1,0,
                                 "sexp_set_current_group_id_x_stub",sexp_set_current_group_id_x_stub
                                 ,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"set-current-effective-user-id!",1,0,
                                 "sexp_set_current_effective_user_id_x_stub",
                                 sexp_set_current_effective_user_id_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"set-current-user-id!",1,0,
                                 "sexp_set_current_user_id_x_stub",sexp_set_current_user_id_x_stub,0
                                );
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"current-effective-group-id",0,0,
                                 "sexp_current_effective_group_id_stub",
                                 sexp_current_effective_group_id_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"current-effective-user-id",0,0,
                                 "sexp_current_effective_user_id_stub",
                                 sexp_current_effective_user_id_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"current-group-id",0,0,
                                 "sexp_current_group_id_stub",sexp_current_group_id_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"current-user-id",0,0,"sexp_current_user_id_stub"
                                 ,sexp_current_user_id_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
    }
    piVar6 = (int *)sexp_define_foreign_aux
                              (local_18,local_30,"get-host-name",0,0,"sexp_get_host_name_stub",
                               sexp_get_host_name_stub,0);
    if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 0x1b)) {
      piVar6[10] = 1;
      piVar6[0xb] = 0;
      piVar6[0xc] = 9;
      piVar6[0xd] = 0;
      piVar6[0xe] = 5;
      piVar6[0xf] = 0;
    }
    *(undefined8 *)(local_18 + 0x6080) = local_60;
    return (sexp_conflict)0x43e;
  }
  return (sexp_conflict)0xb3e;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp sexp_group_type_obj;
  sexp sexp_passwd_type_obj;
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_c_string(ctx, "group", -1);
  sexp_group_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_group_type_obj);
  sexp_type_slots(sexp_group_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_group_type_obj), sexp_intern(ctx, "gr_gid", -1));
  sexp_push(ctx, sexp_type_slots(sexp_group_type_obj), sexp_intern(ctx, "gr_passwd", -1));
  sexp_push(ctx, sexp_type_slots(sexp_group_type_obj), sexp_intern(ctx, "gr_name", -1));
  sexp_type_getters(sexp_group_type_obj) = sexp_make_vector(ctx, SEXP_THREE, SEXP_FALSE);
  sexp_type_setters(sexp_group_type_obj) = sexp_make_vector(ctx, SEXP_THREE, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_group_type_obj);
  name = sexp_intern(ctx, "group?", 6);
  sexp_env_define(ctx, env, name, tmp);
  name = sexp_c_string(ctx, "passwd", -1);
  sexp_passwd_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_passwd_type_obj);
  sexp_type_slots(sexp_passwd_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_shell", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_dir", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_gecos", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_gid", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_uid", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_passwd", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_name", -1));
  sexp_type_getters(sexp_passwd_type_obj) = sexp_make_vector(ctx, SEXP_SEVEN, SEXP_FALSE);
  sexp_type_setters(sexp_passwd_type_obj) = sexp_make_vector(ctx, SEXP_SEVEN, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_passwd_type_obj);
  name = sexp_intern(ctx, "user?", 5);
  sexp_env_define(ctx, env, name, tmp);
  op = sexp_define_foreign(ctx, env, "user-shell", 1, sexp_passwd_get_pw_shell);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_SIX, op);
  op = sexp_define_foreign(ctx, env, "user-home", 1, sexp_passwd_get_pw_dir);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_FIVE, op);
  op = sexp_define_foreign(ctx, env, "user-gecos", 1, sexp_passwd_get_pw_gecos);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_FOUR, op);
  op = sexp_define_foreign(ctx, env, "user-group-id", 1, sexp_passwd_get_pw_gid);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_THREE, op);
  op = sexp_define_foreign(ctx, env, "user-id", 1, sexp_passwd_get_pw_uid);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_TWO, op);
  op = sexp_define_foreign(ctx, env, "user-password", 1, sexp_passwd_get_pw_passwd);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "user-name", 1, sexp_passwd_get_pw_name);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "group-id", 1, sexp_group_get_gr_gid);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_group_type_obj))) sexp_vector_set(sexp_type_getters(sexp_group_type_obj), SEXP_TWO, op);
  op = sexp_define_foreign(ctx, env, "group-password", 1, sexp_group_get_gr_passwd);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_group_type_obj))) sexp_vector_set(sexp_type_getters(sexp_group_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "group-name", 1, sexp_group_get_gr_name);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_group_type_obj))) sexp_vector_set(sexp_type_getters(sexp_group_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "getgrnam-safe", 2, sexp_getgrnam_safe_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj)));
  }
  op = sexp_define_foreign(ctx, env, "getgrgid-safe", 2, sexp_getgrgid_safe_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj)));
  }
  op = sexp_define_foreign(ctx, env, "getpwnam_r", 2, sexp_getpwnam_r_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj)));
  }
  op = sexp_define_foreign(ctx, env, "getpwuid_r", 2, sexp_getpwuid_r_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj)));
  }
  op = sexp_define_foreign(ctx, env, "set-root-directory!", 1, sexp_set_root_directory_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_STRING);
  }
  op = sexp_define_foreign(ctx, env, "create-session", 0, sexp_create_session_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign_opt(ctx, env, "current-session-id", 1, sexp_current_session_id_stub, sexp_make_integer(ctx, 0));
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "set-current-effective-group-id!", 1, sexp_set_current_effective_group_id_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "set-current-group-id!", 1, sexp_set_current_group_id_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "set-current-effective-user-id!", 1, sexp_set_current_effective_user_id_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "set-current-user-id!", 1, sexp_set_current_user_id_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-effective-group-id", 0, sexp_current_effective_group_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-effective-user-id", 0, sexp_current_effective_user_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-group-id", 0, sexp_current_group_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-user-id", 0, sexp_current_user_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "get-host-name", 0, sexp_get_host_name_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_CHAR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}